

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unit.cpp
# Opt level: O2

offset_type
unicpp::as_graphemes::get_codepoint_distance(string *str,const_iterator *b,const_iterator *it)

{
  offset_type oVar1;
  
  oVar1 = std::
          __distance<unicpp::codepoint_iterator<std::__cxx11::string_const&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
                    ((b->codepoint_it).internal_string,(b->codepoint_it).internal_it._M_current,
                     (it->codepoint_it).internal_string,(it->codepoint_it).internal_it._M_current);
  return oVar1;
}

Assistant:

as_graphemes::offset_type as_graphemes::get_codepoint_distance(const string & str, const as_graphemes::const_iterator & b, const as_graphemes::const_iterator & it)
{
    return std::distance(b.codepoint_it, it.codepoint_it);
}